

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_mime * curl_mime_init(Curl_easy *easy)

{
  CURLcode CVar1;
  curl_mime *mime;
  Curl_easy *easy_local;
  
  easy_local = (Curl_easy *)(*Curl_cmalloc)(0x68);
  if (easy_local != (Curl_easy *)0x0) {
    *(Curl_easy **)easy_local = easy;
    easy_local->next = (Curl_easy *)0x0;
    easy_local->prev = (Curl_easy *)0x0;
    easy_local->conn = (connectdata *)0x0;
    memset(&easy_local->connect_queue,0x2d,0x18);
    CVar1 = Curl_rand_hex(easy,(uchar *)&easy_local->conn_queue,0x11);
    if (CVar1 == CURLE_OK) {
      mimesetstate((mime_state *)&easy_local->mstate,MIMESTATE_BEGIN,(void *)0x0);
    }
    else {
      (*Curl_cfree)(easy_local);
      easy_local = (Curl_easy *)0x0;
    }
  }
  return (curl_mime *)easy_local;
}

Assistant:

curl_mime *curl_mime_init(struct Curl_easy *easy)
{
  curl_mime *mime;

  mime = (curl_mime *) malloc(sizeof(*mime));

  if(mime) {
    mime->easy = easy;
    mime->parent = NULL;
    mime->firstpart = NULL;
    mime->lastpart = NULL;

    memset(mime->boundary, '-', MIME_BOUNDARY_DASHES);
    if(Curl_rand_hex(easy,
                     (unsigned char *) &mime->boundary[MIME_BOUNDARY_DASHES],
                     MIME_RAND_BOUNDARY_CHARS + 1)) {
      /* failed to get random separator, bail out */
      free(mime);
      return NULL;
    }
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);
  }

  return mime;
}